

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O1

int ecdsa_signature_parse_der_lax(secp256k1_ecdsa_signature *sig,uchar *input,size_t inputlen)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  uchar tmpsig [64];
  uchar local_78 [64];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78[0x30] = '\0';
  local_78[0x31] = '\0';
  local_78[0x32] = '\0';
  local_78[0x33] = '\0';
  local_78[0x34] = '\0';
  local_78[0x35] = '\0';
  local_78[0x36] = '\0';
  local_78[0x37] = '\0';
  local_78[0x38] = '\0';
  local_78[0x39] = '\0';
  local_78[0x3a] = '\0';
  local_78[0x3b] = '\0';
  local_78[0x3c] = '\0';
  local_78[0x3d] = '\0';
  local_78[0x3e] = '\0';
  local_78[0x3f] = '\0';
  local_78[0x20] = '\0';
  local_78[0x21] = '\0';
  local_78[0x22] = '\0';
  local_78[0x23] = '\0';
  local_78[0x24] = '\0';
  local_78[0x25] = '\0';
  local_78[0x26] = '\0';
  local_78[0x27] = '\0';
  local_78[0x28] = '\0';
  local_78[0x29] = '\0';
  local_78[0x2a] = '\0';
  local_78[0x2b] = '\0';
  local_78[0x2c] = '\0';
  local_78[0x2d] = '\0';
  local_78[0x2e] = '\0';
  local_78[0x2f] = '\0';
  local_78[0x10] = '\0';
  local_78[0x11] = '\0';
  local_78[0x12] = '\0';
  local_78[0x13] = '\0';
  local_78[0x14] = '\0';
  local_78[0x15] = '\0';
  local_78[0x16] = '\0';
  local_78[0x17] = '\0';
  local_78[0x18] = '\0';
  local_78[0x19] = '\0';
  local_78[0x1a] = '\0';
  local_78[0x1b] = '\0';
  local_78[0x1c] = '\0';
  local_78[0x1d] = '\0';
  local_78[0x1e] = '\0';
  local_78[0x1f] = '\0';
  local_78[0] = '\0';
  local_78[1] = '\0';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_78[4] = '\0';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  local_78[8] = '\0';
  local_78[9] = '\0';
  local_78[10] = '\0';
  local_78[0xb] = '\0';
  local_78[0xc] = '\0';
  local_78[0xd] = '\0';
  local_78[0xe] = '\0';
  local_78[0xf] = '\0';
  secp256k1_ecdsa_signature_parse_compact(secp256k1_context_static,sig,local_78);
  iVar2 = 0;
  iVar3 = 0;
  if (((inputlen != 0) && (inputlen != 1)) && (*input == '0')) {
    bVar1 = input[1];
    sVar4 = 2;
    iVar2 = iVar3;
    if ((char)bVar1 < '\0') {
      if (inputlen - 2 < (ulong)bVar1 - 0x80) goto LAB_001eb318;
      sVar4 = (ulong)bVar1 - 0x7e;
    }
    if (((sVar4 != inputlen) && (input[sVar4] == '\x02')) && (sVar4 + 1 != inputlen)) {
      sVar5 = sVar4 + 2;
      uVar11 = (ulong)input[sVar4 + 1];
      if ((char)input[sVar4 + 1] < '\0') {
        uVar10 = uVar11 - 0x80;
        if (inputlen - sVar5 < uVar10) goto LAB_001eb318;
        if (uVar10 != 0) {
          do {
            if (input[sVar5] != '\0') goto LAB_001eb312;
            sVar5 = sVar5 + 1;
            uVar10 = uVar10 - 1;
          } while (uVar10 != 0);
          uVar10 = 0;
          sVar5 = (sVar4 + uVar11) - 0x7e;
        }
LAB_001eb312:
        if (3 < uVar10) goto LAB_001eb318;
        if (uVar10 == 0) {
          uVar11 = 0;
        }
        else {
          uVar7 = 0;
          uVar11 = 0;
          do {
            uVar11 = (ulong)input[uVar7 + sVar5] | uVar11 << 8;
            uVar7 = uVar7 + 1;
          } while (uVar10 != uVar7);
          sVar5 = sVar5 + uVar10;
        }
      }
      if (((uVar11 <= inputlen - sVar5) && (sVar4 = sVar5 + uVar11, sVar4 != inputlen)) &&
         ((input[sVar4] == '\x02' && (sVar4 + 1 != inputlen)))) {
        lVar9 = sVar4 + 2;
        uVar10 = (ulong)input[sVar4 + 1];
        if ((char)input[sVar4 + 1] < '\0') {
          uVar7 = uVar10 - 0x80;
          if (inputlen - lVar9 < uVar7) goto LAB_001eb318;
          if (uVar7 != 0) {
            do {
              if (input[lVar9] != '\0') goto LAB_001eb486;
              lVar9 = lVar9 + 1;
              uVar7 = uVar7 - 1;
            } while (uVar7 != 0);
            uVar7 = 0;
            lVar9 = uVar10 + sVar5 + uVar11 + -0x7e;
          }
LAB_001eb486:
          if (3 < uVar7) goto LAB_001eb318;
          if (uVar7 == 0) {
            uVar10 = 0;
          }
          else {
            uVar8 = 0;
            uVar10 = 0;
            do {
              uVar10 = (ulong)input[uVar8 + lVar9] | uVar10 << 8;
              uVar8 = uVar8 + 1;
            } while (uVar7 != uVar8);
            lVar9 = lVar9 + uVar7;
          }
        }
        if (uVar10 <= inputlen - lVar9) {
          if (uVar11 != 0) {
            do {
              if (input[sVar5] != '\0') goto LAB_001eb3b1;
              sVar5 = sVar5 + 1;
              uVar11 = uVar11 - 1;
            } while (uVar11 != 0);
            uVar11 = 0;
            sVar5 = sVar4;
          }
LAB_001eb3b1:
          if (uVar11 < 0x21) {
            lVar6 = 0;
            if (0x20 - uVar11 < 0x41) {
              lVar6 = 0x40 - (0x20 - uVar11);
            }
            __memcpy_chk(local_78 + (0x20 - uVar11),input + sVar5,uVar11,lVar6);
          }
          if (uVar10 != 0) {
            lVar6 = uVar10 + lVar9;
            do {
              if (input[lVar9] != '\0') goto LAB_001eb412;
              lVar9 = lVar9 + 1;
              uVar10 = uVar10 - 1;
            } while (uVar10 != 0);
            uVar10 = 0;
            lVar9 = lVar6;
          }
LAB_001eb412:
          if ((uVar10 < 0x21) &&
             (memcpy((void *)((long)&local_38 - uVar10),input + lVar9,uVar10), uVar11 < 0x21)) {
            iVar3 = secp256k1_ecdsa_signature_parse_compact(secp256k1_context_static,sig,local_78);
            iVar2 = 1;
            if (iVar3 != 0) goto LAB_001eb318;
          }
          local_78[0x30] = '\0';
          local_78[0x31] = '\0';
          local_78[0x32] = '\0';
          local_78[0x33] = '\0';
          local_78[0x34] = '\0';
          local_78[0x35] = '\0';
          local_78[0x36] = '\0';
          local_78[0x37] = '\0';
          local_78[0x38] = '\0';
          local_78[0x39] = '\0';
          local_78[0x3a] = '\0';
          local_78[0x3b] = '\0';
          local_78[0x3c] = '\0';
          local_78[0x3d] = '\0';
          local_78[0x3e] = '\0';
          local_78[0x3f] = '\0';
          local_78[0x20] = '\0';
          local_78[0x21] = '\0';
          local_78[0x22] = '\0';
          local_78[0x23] = '\0';
          local_78[0x24] = '\0';
          local_78[0x25] = '\0';
          local_78[0x26] = '\0';
          local_78[0x27] = '\0';
          local_78[0x28] = '\0';
          local_78[0x29] = '\0';
          local_78[0x2a] = '\0';
          local_78[0x2b] = '\0';
          local_78[0x2c] = '\0';
          local_78[0x2d] = '\0';
          local_78[0x2e] = '\0';
          local_78[0x2f] = '\0';
          local_78[0x10] = '\0';
          local_78[0x11] = '\0';
          local_78[0x12] = '\0';
          local_78[0x13] = '\0';
          local_78[0x14] = '\0';
          local_78[0x15] = '\0';
          local_78[0x16] = '\0';
          local_78[0x17] = '\0';
          local_78[0x18] = '\0';
          local_78[0x19] = '\0';
          local_78[0x1a] = '\0';
          local_78[0x1b] = '\0';
          local_78[0x1c] = '\0';
          local_78[0x1d] = '\0';
          local_78[0x1e] = '\0';
          local_78[0x1f] = '\0';
          local_78[0] = '\0';
          local_78[1] = '\0';
          local_78[2] = '\0';
          local_78[3] = '\0';
          local_78[4] = '\0';
          local_78[5] = '\0';
          local_78[6] = '\0';
          local_78[7] = '\0';
          local_78[8] = '\0';
          local_78[9] = '\0';
          local_78[10] = '\0';
          local_78[0xb] = '\0';
          local_78[0xc] = '\0';
          local_78[0xd] = '\0';
          local_78[0xe] = '\0';
          local_78[0xf] = '\0';
          secp256k1_ecdsa_signature_parse_compact(secp256k1_context_static,sig,local_78);
          iVar2 = 1;
        }
      }
    }
  }
LAB_001eb318:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

int ecdsa_signature_parse_der_lax(secp256k1_ecdsa_signature* sig, const unsigned char *input, size_t inputlen) {
    size_t rpos, rlen, spos, slen;
    size_t pos = 0;
    size_t lenbyte;
    unsigned char tmpsig[64] = {0};
    int overflow = 0;

    /* Hack to initialize sig with a correctly-parsed but invalid signature. */
    secp256k1_ecdsa_signature_parse_compact(secp256k1_context_static, sig, tmpsig);

    /* Sequence tag byte */
    if (pos == inputlen || input[pos] != 0x30) {
        return 0;
    }
    pos++;

    /* Sequence length bytes */
    if (pos == inputlen) {
        return 0;
    }
    lenbyte = input[pos++];
    if (lenbyte & 0x80) {
        lenbyte -= 0x80;
        if (lenbyte > inputlen - pos) {
            return 0;
        }
        pos += lenbyte;
    }

    /* Integer tag byte for R */
    if (pos == inputlen || input[pos] != 0x02) {
        return 0;
    }
    pos++;

    /* Integer length for R */
    if (pos == inputlen) {
        return 0;
    }
    lenbyte = input[pos++];
    if (lenbyte & 0x80) {
        lenbyte -= 0x80;
        if (lenbyte > inputlen - pos) {
            return 0;
        }
        while (lenbyte > 0 && input[pos] == 0) {
            pos++;
            lenbyte--;
        }
        static_assert(sizeof(size_t) >= 4, "size_t too small");
        if (lenbyte >= 4) {
            return 0;
        }
        rlen = 0;
        while (lenbyte > 0) {
            rlen = (rlen << 8) + input[pos];
            pos++;
            lenbyte--;
        }
    } else {
        rlen = lenbyte;
    }
    if (rlen > inputlen - pos) {
        return 0;
    }
    rpos = pos;
    pos += rlen;

    /* Integer tag byte for S */
    if (pos == inputlen || input[pos] != 0x02) {
        return 0;
    }
    pos++;

    /* Integer length for S */
    if (pos == inputlen) {
        return 0;
    }
    lenbyte = input[pos++];
    if (lenbyte & 0x80) {
        lenbyte -= 0x80;
        if (lenbyte > inputlen - pos) {
            return 0;
        }
        while (lenbyte > 0 && input[pos] == 0) {
            pos++;
            lenbyte--;
        }
        static_assert(sizeof(size_t) >= 4, "size_t too small");
        if (lenbyte >= 4) {
            return 0;
        }
        slen = 0;
        while (lenbyte > 0) {
            slen = (slen << 8) + input[pos];
            pos++;
            lenbyte--;
        }
    } else {
        slen = lenbyte;
    }
    if (slen > inputlen - pos) {
        return 0;
    }
    spos = pos;

    /* Ignore leading zeroes in R */
    while (rlen > 0 && input[rpos] == 0) {
        rlen--;
        rpos++;
    }
    /* Copy R value */
    if (rlen > 32) {
        overflow = 1;
    } else {
        memcpy(tmpsig + 32 - rlen, input + rpos, rlen);
    }

    /* Ignore leading zeroes in S */
    while (slen > 0 && input[spos] == 0) {
        slen--;
        spos++;
    }
    /* Copy S value */
    if (slen > 32) {
        overflow = 1;
    } else {
        memcpy(tmpsig + 64 - slen, input + spos, slen);
    }

    if (!overflow) {
        overflow = !secp256k1_ecdsa_signature_parse_compact(secp256k1_context_static, sig, tmpsig);
    }
    if (overflow) {
        /* Overwrite the result again with a correctly-parsed but invalid
           signature if parsing failed. */
        memset(tmpsig, 0, 64);
        secp256k1_ecdsa_signature_parse_compact(secp256k1_context_static, sig, tmpsig);
    }
    return 1;
}